

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

void av1_cyclic_refresh_setup(AV1_COMP *cpi)

{
  FRAME_TYPE FVar1;
  CYCLIC_REFRESH *pCVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  segmentation *seg_00;
  AV1_COMP *in_RDI;
  bool bVar7;
  double dVar8;
  int qindex2;
  int qindex_delta;
  CommonQuantParams *quant_params;
  double q;
  uchar *seg_map;
  int resolution_change;
  FRAME_TYPE frame_type;
  int layer_depth;
  int boost_index;
  GF_GROUP *gf_group;
  int scene_change_detected;
  segmentation *seg;
  CYCLIC_REFRESH *cr;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff58;
  aom_bit_depth_t in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  int is_stat_consumption_stage;
  aom_tune_metric in_stack_ffffffffffffff80;
  int local_70;
  undefined4 in_stack_ffffffffffffffd0;
  
  pCVar2 = in_RDI->cyclic_refresh;
  seg_00 = &(in_RDI->common).seg;
  iVar3 = is_scene_change_detected(in_RDI);
  if ((in_RDI->ppi->gf_group).layer_depth[in_RDI->gf_frame_index] < 6) {
    local_70 = (in_RDI->ppi->gf_group).layer_depth[in_RDI->gf_frame_index];
  }
  else {
    local_70 = 6;
  }
  FVar1 = (in_RDI->common).current_frame.frame_type;
  bVar7 = false;
  if (((((in_RDI->rc).rtc_external_ratectrl == 0) &&
       (bVar7 = false, (in_RDI->common).prev_frame != (RefCntBuffer *)0x0)) &&
      (bVar7 = false, (in_RDI->svc).number_spatial_layers == 1)) &&
     (bVar7 = true, (in_RDI->common).width == ((in_RDI->common).prev_frame)->width)) {
    bVar7 = (in_RDI->common).height != ((in_RDI->common).prev_frame)->height;
  }
  if ((bVar7) && ((in_RDI->svc).temporal_layer_id == 0)) {
    cyclic_refresh_reset_resize
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  if (pCVar2->apply_cyclic_refresh == 0) {
    if (((in_RDI->active_map).enabled == 0) || ((in_RDI->rc).percent_blocks_inactive == 100)) {
      memset((in_RDI->enc_seg).map,0,
             (long)((in_RDI->common).mi_params.mi_rows * (in_RDI->common).mi_params.mi_cols));
      av1_disable_segmentation(&(in_RDI->common).seg);
    }
    iVar4 = frame_is_intra_only(&in_RDI->common);
    if (((iVar4 != 0) || (iVar3 != 0)) || (((in_RDI->ppi->rtc_ref).bias_recovery_frame & 1U) != 0))
    {
      pCVar2->sb_index = 0;
      pCVar2->last_sb_index = 0;
      pCVar2->counter_encode_maxq_scene_change = 0;
      pCVar2->actual_num_seg1_blocks = 0;
      pCVar2->actual_num_seg2_blocks = 0;
    }
  }
  else {
    pCVar2->counter_encode_maxq_scene_change = pCVar2->counter_encode_maxq_scene_change + 1;
    dVar8 = av1_convert_qindex_to_q(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    pCVar2->thresh_rate_sb = (long)(in_RDI->rc).sb64_target_rate << 10;
    pCVar2->thresh_dist_sb = (long)(dVar8 * dVar8) << 2;
    if (((in_RDI->oxcf).speed < 8) || ((in_RDI->common).width * (in_RDI->common).height < 0x38400))
    {
      pCVar2->thresh_dist_sb = 0;
      pCVar2->thresh_rate_sb = 0x7fffffffffffffff;
    }
    av1_enable_segmentation(&(in_RDI->common).seg);
    if ((in_RDI->active_map).enabled == 0) {
      av1_clearall_segfeatures((segmentation *)0x70792d);
    }
    av1_disable_segfeature(seg_00,0,'\0');
    av1_enable_segfeature(seg_00,1,'\0');
    av1_enable_segfeature(seg_00,2,'\0');
    iVar4 = compute_deltaq((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                           ,in_stack_ffffffffffffff4c,
                           (double)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    pCVar2->qindex_delta[1] = iVar4;
    iVar5 = clamp((in_RDI->common).quant_params.base_qindex +
                  (in_RDI->common).quant_params.y_dc_delta_q + iVar4,0,0xff);
    is_stat_consumption_stage = CONCAT13(FVar1,(int3)in_stack_ffffffffffffff78);
    iVar6 = ::is_stat_consumption_stage
                      ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    iVar5 = av1_compute_rd_mult(iVar5,in_stack_ffffffffffffff60,
                                (FRAME_UPDATE_TYPE)((ulong)in_stack_ffffffffffffff58 >> 0x38),
                                (int)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                (FRAME_TYPE)((uint)in_stack_ffffffffffffff50 >> 0x18),local_70,
                                is_stat_consumption_stage,in_stack_ffffffffffffff80);
    pCVar2->rdmult = iVar5;
    av1_set_segdata(seg_00,1,'\0',iVar4);
    iVar4 = compute_deltaq((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                           ,in_stack_ffffffffffffff4c,
                           (double)CONCAT44(in_stack_ffffffffffffff44,iVar6));
    pCVar2->qindex_delta[2] = iVar4;
    av1_set_segdata(seg_00,2,'\0',iVar4);
    cyclic_refresh_update_map((AV1_COMP *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void av1_cyclic_refresh_setup(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  struct segmentation *const seg = &cm->seg;
  const int scene_change_detected = is_scene_change_detected(cpi);
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  // Set resolution_change flag: for single spatial layers only.
  const int resolution_change = !cpi->rc.rtc_external_ratectrl &&
                                cm->prev_frame &&
                                cpi->svc.number_spatial_layers == 1 &&
                                (cm->width != cm->prev_frame->width ||
                                 cm->height != cm->prev_frame->height);

  if (resolution_change && cpi->svc.temporal_layer_id == 0)
    cyclic_refresh_reset_resize(cpi);
  if (!cr->apply_cyclic_refresh) {
    // Don't disable and set seg_map to 0 if active_maps is enabled, unless
    // whole frame is set as inactive (since we only apply cyclic_refresh to
    // active blocks).
    if (!cpi->active_map.enabled || cpi->rc.percent_blocks_inactive == 100) {
      unsigned char *const seg_map = cpi->enc_seg.map;
      memset(seg_map, 0, cm->mi_params.mi_rows * cm->mi_params.mi_cols);
      av1_disable_segmentation(&cm->seg);
    }
    if (frame_is_intra_only(cm) || scene_change_detected ||
        cpi->ppi->rtc_ref.bias_recovery_frame) {
      cr->sb_index = 0;
      cr->last_sb_index = 0;
      cr->counter_encode_maxq_scene_change = 0;
      cr->actual_num_seg1_blocks = 0;
      cr->actual_num_seg2_blocks = 0;
    }
    return;
  } else {
    cr->counter_encode_maxq_scene_change++;
    const double q = av1_convert_qindex_to_q(cm->quant_params.base_qindex,
                                             cm->seq_params->bit_depth);
    // Set rate threshold to some multiple (set to 2 for now) of the target
    // rate (target is given by sb64_target_rate and scaled by 256).
    cr->thresh_rate_sb = ((int64_t)(rc->sb64_target_rate) << 8) << 2;
    // Distortion threshold, quadratic in Q, scale factor to be adjusted.
    // q will not exceed 457, so (q * q) is within 32bit; see:
    // av1_convert_qindex_to_q(), av1_ac_quant(), ac_qlookup*[].
    cr->thresh_dist_sb = ((int64_t)(q * q)) << 2;
    // For low-resoln or lower speeds, the rate/dist thresholds need to be
    // tuned/updated.
    if (cpi->oxcf.speed <= 7 || (cm->width * cm->height < 640 * 360)) {
      cr->thresh_dist_sb = 0;
      cr->thresh_rate_sb = INT64_MAX;
    }
    // Set up segmentation.
    av1_enable_segmentation(&cm->seg);
    if (!cpi->active_map.enabled) {
      // Clear down the segment map, only if active_maps is not enabled.
      av1_clearall_segfeatures(seg);
    }

    // Note: setting temporal_update has no effect, as the seg-map coding method
    // (temporal or spatial) is determined in
    // av1_choose_segmap_coding_method(),
    // based on the coding cost of each method. For error_resilient mode on the
    // last_frame_seg_map is set to 0, so if temporal coding is used, it is
    // relative to 0 previous map.
    // seg->temporal_update = 0;

    // Segment BASE "Q" feature is disabled so it defaults to the baseline Q.
    av1_disable_segfeature(seg, CR_SEGMENT_ID_BASE, SEG_LVL_ALT_Q);
    // Use segment BOOST1 for in-frame Q adjustment.
    av1_enable_segfeature(seg, CR_SEGMENT_ID_BOOST1, SEG_LVL_ALT_Q);
    // Use segment BOOST2 for more aggressive in-frame Q adjustment.
    av1_enable_segfeature(seg, CR_SEGMENT_ID_BOOST2, SEG_LVL_ALT_Q);

    // Set the q delta for segment BOOST1.
    const CommonQuantParams *const quant_params = &cm->quant_params;
    int qindex_delta =
        compute_deltaq(cpi, quant_params->base_qindex, cr->rate_ratio_qdelta);
    cr->qindex_delta[1] = qindex_delta;

    // Compute rd-mult for segment BOOST1.
    const int qindex2 = clamp(
        quant_params->base_qindex + quant_params->y_dc_delta_q + qindex_delta,
        0, MAXQ);
    cr->rdmult = av1_compute_rd_mult(
        qindex2, cm->seq_params->bit_depth,
        cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
        boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
        is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

    av1_set_segdata(seg, CR_SEGMENT_ID_BOOST1, SEG_LVL_ALT_Q, qindex_delta);

    // Set a more aggressive (higher) q delta for segment BOOST2.
    qindex_delta = compute_deltaq(
        cpi, quant_params->base_qindex,
        AOMMIN(CR_MAX_RATE_TARGET_RATIO,
               0.1 * cr->rate_boost_fac * cr->rate_ratio_qdelta));
    cr->qindex_delta[2] = qindex_delta;
    av1_set_segdata(seg, CR_SEGMENT_ID_BOOST2, SEG_LVL_ALT_Q, qindex_delta);

    // Update the segmentation and refresh map.
    cyclic_refresh_update_map(cpi);
  }
}